

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackBackTrace.h
# Opt level: O0

StackBackTrace *
StackBackTrace::Capture<Memory::NoThrowHeapAllocator>
          (NoThrowHeapAllocator *alloc,ULONG framesToSkip,ULONG framesToCapture)

{
  NoThrowHeapAllocator *alloc_00;
  StackBackTrace *this;
  TrackAllocData local_40;
  ULONG local_18;
  ULONG local_14;
  ULONG framesToCapture_local;
  ULONG framesToSkip_local;
  NoThrowHeapAllocator *alloc_local;
  
  local_18 = framesToCapture;
  local_14 = framesToSkip;
  _framesToCapture_local = alloc;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&typeinfo,(ulong)framesToCapture << 3,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/StackBackTrace.h"
             ,0x2f);
  alloc_00 = Memory::NoThrowHeapAllocator::TrackAllocInfo(alloc,&local_40);
  this = (StackBackTrace *)new<Memory::NoThrowHeapAllocator>(8,alloc_00,0x8f5db0,0);
  StackBackTrace(this,local_14,local_18);
  return this;
}

Assistant:

StackBackTrace *
StackBackTrace::Capture(TAllocator * alloc, ULONG framesToSkip, ULONG framesToCapture)
{
    return AllocatorNewPlusZ(TAllocator, alloc, sizeof(PVOID) * framesToCapture, StackBackTrace, framesToSkip, framesToCapture);
}